

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

bool __thiscall QJsonPrivate::Parser::parseMember(Parser *this)

{
  bool bVar1;
  char cVar2;
  
  bVar1 = parseString(this);
  if (bVar1) {
    cVar2 = nextToken(this);
    if (cVar2 == ':') {
      bVar1 = eatSpace(this);
      if (bVar1) {
        bVar1 = parseValueIntoContainer(this);
        return bVar1;
      }
      this->lastError = UnterminatedObject;
    }
    else {
      this->lastError = MissingNameSeparator;
    }
  }
  return false;
}

Assistant:

bool Parser::parseMember()
{
    if (!parseString())
        return false;
    char token = nextToken();
    if (token != NameSeparator) {
        lastError = QJsonParseError::MissingNameSeparator;
        return false;
    }
    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    return parseValueIntoContainer();
}